

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Bool storeRawNames(XML_Parser parser)

{
  char *pcVar1;
  XML_Char *pXVar2;
  XML_Char *pXVar3;
  int iVar4;
  size_t sVar5;
  TAG *pTVar6;
  char *__dest;
  long lVar7;
  
  pTVar6 = parser->m_tagStack;
  do {
    if (pTVar6 == (TAG *)0x0) {
      return '\x01';
    }
    lVar7 = (long)(pTVar6->name).strLen;
    pcVar1 = pTVar6->buf;
    __dest = pcVar1 + lVar7 + 1;
    if (pTVar6->rawName == __dest) {
      iVar4 = 3;
    }
    else {
      lVar7 = lVar7 + 1;
      iVar4 = 1;
      if ((ulong)(long)pTVar6->rawNameLength <= 0x7fffffffU - lVar7) {
        sVar5 = (long)pTVar6->rawNameLength + (long)(int)lVar7;
        if ((long)pTVar6->bufEnd - (long)pcVar1 < (long)sVar5) {
          pXVar3 = (XML_Char *)(*(parser->m_mem).realloc_fcn)(pcVar1,sVar5);
          if (pXVar3 != (XML_Char *)0x0) {
            pcVar1 = pTVar6->buf;
            if ((pTVar6->name).str == pcVar1) {
              (pTVar6->name).str = pXVar3;
            }
            pXVar2 = (pTVar6->name).localPart;
            if (pXVar2 != (XML_Char *)0x0) {
              (pTVar6->name).localPart = pXVar3 + ((long)pXVar2 - (long)pcVar1);
            }
            pTVar6->buf = pXVar3;
            pTVar6->bufEnd = pXVar3 + sVar5;
            __dest = pXVar3 + lVar7;
          }
          if (pXVar3 == (XML_Char *)0x0) goto LAB_005f9b0f;
        }
        memcpy(__dest,pTVar6->rawName,(long)pTVar6->rawNameLength);
        pTVar6->rawName = __dest;
        pTVar6 = pTVar6->parent;
        iVar4 = 0;
      }
    }
LAB_005f9b0f:
    if (iVar4 != 0) {
      return iVar4 == 3;
    }
  } while( true );
}

Assistant:

static XML_Bool
storeRawNames(XML_Parser parser) {
  TAG *tag = parser->m_tagStack;
  while (tag) {
    int bufSize;
    int nameLen = sizeof(XML_Char) * (tag->name.strLen + 1);
    size_t rawNameLen;
    char *rawNameBuf = tag->buf + nameLen;
    /* Stop if already stored.  Since m_tagStack is a stack, we can stop
       at the first entry that has already been copied; everything
       below it in the stack is already been accounted for in a
       previous call to this function.
    */
    if (tag->rawName == rawNameBuf)
      break;
    /* For re-use purposes we need to ensure that the
       size of tag->buf is a multiple of sizeof(XML_Char).
    */
    rawNameLen = ROUND_UP(tag->rawNameLength, sizeof(XML_Char));
    /* Detect and prevent integer overflow. */
    if (rawNameLen > (size_t)INT_MAX - nameLen)
      return XML_FALSE;
    bufSize = nameLen + (int)rawNameLen;
    if (bufSize > tag->bufEnd - tag->buf) {
      char *temp = (char *)REALLOC(parser, tag->buf, bufSize);
      if (temp == NULL)
        return XML_FALSE;
      /* if tag->name.str points to tag->buf (only when namespace
         processing is off) then we have to update it
      */
      if (tag->name.str == (XML_Char *)tag->buf)
        tag->name.str = (XML_Char *)temp;
      /* if tag->name.localPart is set (when namespace processing is on)
         then update it as well, since it will always point into tag->buf
      */
      if (tag->name.localPart)
        tag->name.localPart
            = (XML_Char *)temp + (tag->name.localPart - (XML_Char *)tag->buf);
      tag->buf = temp;
      tag->bufEnd = temp + bufSize;
      rawNameBuf = temp + nameLen;
    }
    memcpy(rawNameBuf, tag->rawName, tag->rawNameLength);
    tag->rawName = rawNameBuf;
    tag = tag->parent;
  }
  return XML_TRUE;
}